

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O0

QList<int> * __thiscall
QDockAreaLayout::gapIndex(QDockAreaLayout *this,QPoint *pos,bool disallowTabs)

{
  bool bVar1;
  Int IVar2;
  ulong uVar3;
  byte in_CL;
  undefined8 in_RDX;
  QPoint *in_RSI;
  QDockAreaLayout *in_RDI;
  long in_FS_OFFSET;
  QDockAreaLayoutInfo *info_1;
  int i_1;
  QDockAreaLayoutInfo *info;
  int i;
  TabMode tabMode;
  bool nestingEnabled;
  QList<int> *result;
  QRect r;
  DockOptions opts;
  undefined4 in_stack_ffffffffffffff38;
  DockOption in_stack_ffffffffffffff3c;
  undefined6 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff46;
  byte bVar4;
  undefined1 in_stack_ffffffffffffff47;
  int local_98;
  int local_84;
  QPoint *_pos;
  QDockAreaLayout *this_00;
  undefined1 local_60 [24];
  undefined1 local_48 [24];
  QFlagsStorageHelper<QMainWindow::DockOption,_4> local_30;
  undefined1 local_2c [16];
  QFlagsStorageHelper<QMainWindow::DockOption,_4> local_1c;
  QFlagsStorageHelper<QMainWindow::DockOption,_4> local_18;
  QFlagsStorageHelper<QMainWindow::DockOption,_4> local_14;
  QFlagsStorageHelper<QMainWindow::DockOption,_4> local_10;
  QFlagsStorageHelper<QMainWindow::DockOption,_4> local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_c.super_QFlagsStorage<QMainWindow::DockOption>.i =
       (QFlagsStorage<QMainWindow::DockOption>)0xaaaaaaaa;
  _pos = in_RSI;
  this_00 = in_RDI;
  local_c.super_QFlagsStorage<QMainWindow::DockOption>.i =
       (QFlagsStorage<QMainWindow::DockOption>)
       QMainWindow::dockOptions
                 ((QMainWindow *)
                  CONCAT17(in_stack_ffffffffffffff47,
                           CONCAT16(in_stack_ffffffffffffff46,in_stack_ffffffffffffff40)));
  local_10.super_QFlagsStorage<QMainWindow::DockOption>.i =
       (QFlagsStorage<QMainWindow::DockOption>)
       QFlags<QMainWindow::DockOption>::operator&
                 ((QFlags<QMainWindow::DockOption> *)
                  CONCAT17(in_stack_ffffffffffffff47,
                           CONCAT16(in_stack_ffffffffffffff46,in_stack_ffffffffffffff40)),
                  in_stack_ffffffffffffff3c);
  ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_10);
  if ((in_CL & 1) == 0) {
    local_14.super_QFlagsStorage<QMainWindow::DockOption>.i =
         (QFlagsStorage<QMainWindow::DockOption>)
         QFlags<QMainWindow::DockOption>::operator&
                   ((QFlags<QMainWindow::DockOption> *)
                    CONCAT17(in_stack_ffffffffffffff47,
                             CONCAT16(in_stack_ffffffffffffff46,in_stack_ffffffffffffff40)),
                    in_stack_ffffffffffffff3c);
    IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_14);
    in_stack_ffffffffffffff47 = true;
    if (IVar2 == 0) {
      local_18.super_QFlagsStorage<QMainWindow::DockOption>.i =
           (QFlagsStorage<QMainWindow::DockOption>)
           QFlags<QMainWindow::DockOption>::operator&
                     ((QFlags<QMainWindow::DockOption> *)
                      CONCAT17(1,CONCAT16(in_stack_ffffffffffffff46,in_stack_ffffffffffffff40)),
                      in_stack_ffffffffffffff3c);
      IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_18);
      in_stack_ffffffffffffff47 = IVar2 != 0;
    }
    local_1c.super_QFlagsStorage<QMainWindow::DockOption>.i =
         (QFlagsStorage<QMainWindow::DockOption>)
         QFlags<QMainWindow::DockOption>::operator&
                   ((QFlags<QMainWindow::DockOption> *)
                    CONCAT17(in_stack_ffffffffffffff47,
                             CONCAT16(in_stack_ffffffffffffff46,in_stack_ffffffffffffff40)),
                    in_stack_ffffffffffffff3c);
    ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_1c);
  }
  for (local_84 = 0; local_84 < 4; local_84 = local_84 + 1) {
    bVar1 = QDockAreaLayoutInfo::isEmpty((QDockAreaLayoutInfo *)0x577558);
    if ((!bVar1) &&
       (uVar3 = QRect::contains((QPoint *)(in_RSI + (long)local_84 * 0xe + 0xd),SUB81(in_RDX,0)),
       (uVar3 & 1) != 0)) {
      ((DataPointer *)in_RDI->corners)->d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      ((DataPointer *)in_RDI->corners)->ptr = (int *)&DAT_aaaaaaaaaaaaaaaa;
      *(undefined1 **)&in_RDI->rect = &DAT_aaaaaaaaaaaaaaaa;
      QDockAreaLayoutInfo::gapIndex
                ((QDockAreaLayoutInfo *)this_00,_pos,SUB81((ulong)in_RDX >> 0x38,0),(TabMode)in_RDX)
      ;
      bVar1 = QList<int>::isEmpty((QList<int> *)0x5775df);
      if (!bVar1) {
        QList<int>::prepend((QList<int> *)0x5775f1,in_stack_ffffffffffffff3c);
      }
      goto LAB_005777f7;
    }
  }
  local_98 = 0;
  do {
    if (3 < local_98) {
      memset(in_RDI,0,0x18);
      QList<int>::QList((QList<int> *)0x5777f7);
LAB_005777f7:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        return (QList<int> *)in_RDI;
      }
      __stack_chk_fail();
    }
    bVar1 = QDockAreaLayoutInfo::isEmpty((QDockAreaLayoutInfo *)0x577664);
    if (bVar1) {
      local_2c._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_2c._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_2c = (undefined1  [16])gapRect(this_00,(DockPosition)((ulong)_pos >> 0x20));
      uVar3 = QRect::contains((QPoint *)local_2c,SUB81(in_RDX,0));
      if ((uVar3 & 1) != 0) {
        local_30.super_QFlagsStorage<QMainWindow::DockOption>.i =
             (QFlagsStorage<QMainWindow::DockOption>)
             QFlags<QMainWindow::DockOption>::operator&
                       ((QFlags<QMainWindow::DockOption> *)
                        CONCAT17(in_stack_ffffffffffffff47,
                                 CONCAT16(in_stack_ffffffffffffff46,in_stack_ffffffffffffff40)),
                        in_stack_ffffffffffffff3c);
        IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_30);
        bVar4 = 0;
        if (IVar2 != 0) {
          bVar1 = QList<QDockAreaLayoutItem>::isEmpty((QList<QDockAreaLayoutItem> *)0x577707);
          bVar4 = bVar1 ^ 0xff;
        }
        if ((bVar4 & 1) == 0) {
          memset(local_60,0,0x18);
          QList<int>::QList((QList<int> *)0x577797);
          QList<int>::operator<<
                    ((QList<int> *)
                     CONCAT17(in_stack_ffffffffffffff47,CONCAT16(bVar4,in_stack_ffffffffffffff40)),
                     in_stack_ffffffffffffff3c);
          QList<int>::operator<<
                    ((QList<int> *)
                     CONCAT17(in_stack_ffffffffffffff47,CONCAT16(bVar4,in_stack_ffffffffffffff40)),
                     in_stack_ffffffffffffff3c);
          QList<int>::QList((QList<int> *)
                            CONCAT17(in_stack_ffffffffffffff47,
                                     CONCAT16(bVar4,in_stack_ffffffffffffff40)),
                            (QList<int> *)
                            CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
          QList<int>::~QList((QList<int> *)0x5777c6);
        }
        else {
          memset(local_48,0,0x18);
          QList<int>::QList((QList<int> *)0x577738);
          QList<int>::operator<<
                    ((QList<int> *)
                     CONCAT17(in_stack_ffffffffffffff47,CONCAT16(bVar4,in_stack_ffffffffffffff40)),
                     in_stack_ffffffffffffff3c);
          QList<int>::operator<<
                    ((QList<int> *)
                     CONCAT17(in_stack_ffffffffffffff47,CONCAT16(bVar4,in_stack_ffffffffffffff40)),
                     in_stack_ffffffffffffff3c);
          QList<int>::operator<<
                    ((QList<int> *)
                     CONCAT17(in_stack_ffffffffffffff47,CONCAT16(bVar4,in_stack_ffffffffffffff40)),
                     in_stack_ffffffffffffff3c);
          QList<int>::QList((QList<int> *)
                            CONCAT17(in_stack_ffffffffffffff47,
                                     CONCAT16(bVar4,in_stack_ffffffffffffff40)),
                            (QList<int> *)
                            CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
          QList<int>::~QList((QList<int> *)0x57777a);
        }
        goto LAB_005777f7;
      }
    }
    local_98 = local_98 + 1;
  } while( true );
}

Assistant:

QList<int> QDockAreaLayout::gapIndex(const QPoint &pos, bool disallowTabs) const
{
    QMainWindow::DockOptions opts = mainWindow->dockOptions();
    bool nestingEnabled = opts & QMainWindow::AllowNestedDocks;
    QDockAreaLayoutInfo::TabMode tabMode = QDockAreaLayoutInfo::NoTabs;
#if QT_CONFIG(tabbar)
    if (!disallowTabs) {
        if (opts & QMainWindow::AllowTabbedDocks || opts & QMainWindow::VerticalTabs)
            tabMode = QDockAreaLayoutInfo::AllowTabs;
        if (opts & QMainWindow::ForceTabbedDocks)
            tabMode = QDockAreaLayoutInfo::ForceTabs;

        if (tabMode == QDockAreaLayoutInfo::ForceTabs)
            nestingEnabled = false;
    }
#endif


    for (int i = 0; i < QInternal::DockCount; ++i) {
        const QDockAreaLayoutInfo &info = docks[i];

        if (!info.isEmpty() && info.rect.contains(pos)) {
            QList<int> result
                = docks[i].gapIndex(pos, nestingEnabled, tabMode);
            if (!result.isEmpty())
                result.prepend(i);
            return result;
        }
    }

    for (int i = 0; i < QInternal::DockCount; ++i) {
        const QDockAreaLayoutInfo &info = docks[i];

        if (info.isEmpty()) {
            const QRect r = gapRect(static_cast<QInternal::DockPosition>(i));
            if (r.contains(pos)) {
                if (opts & QMainWindow::ForceTabbedDocks && !info.item_list.isEmpty()) {
                    //in case of ForceTabbedDocks, we pass -1 in order to force the gap to be tabbed
                    //it mustn't be completely empty otherwise it won't work
                    return QList<int>() << i << -1 << 0;
                } else {
                    return QList<int>() << i << 0;
                }
            }
        }
    }

    return QList<int>();
}